

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindow::childEvent(QMdiSubWindow *this,QChildEvent *childEvent)

{
  Type TVar1;
  QSizeGrip *pQVar2;
  QEvent *in_RSI;
  QSizeGrip *sizeGrip;
  QMdiSubWindowPrivate *in_stack_00000028;
  
  TVar1 = QEvent::type(in_RSI);
  if (TVar1 == ChildPolished) {
    QChildEvent::child((QChildEvent *)in_RSI);
    pQVar2 = qobject_cast<QSizeGrip*>((QObject *)0x63734f);
    if (pQVar2 != (QSizeGrip *)0x0) {
      d_func((QMdiSubWindow *)0x637366);
      QMdiSubWindowPrivate::setSizeGrip(in_stack_00000028,(QSizeGrip *)this);
    }
  }
  return;
}

Assistant:

void QMdiSubWindow::childEvent(QChildEvent *childEvent)
{
    if (childEvent->type() != QEvent::ChildPolished)
        return;
#if QT_CONFIG(sizegrip)
    if (QSizeGrip *sizeGrip = qobject_cast<QSizeGrip *>(childEvent->child()))
        d_func()->setSizeGrip(sizeGrip);
#endif
}